

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O1

void nga_vfill_patch(Integer *g_a,Integer *lo,Integer *hi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Integer IVar3;
  logical lVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  int iVar16;
  undefined1 auVar14 [16];
  int iVar17;
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  void *data_ptr;
  Integer ndim;
  Integer hiA [7];
  Integer loA [7];
  Integer type;
  Integer baseld [7];
  Integer bunit [7];
  Integer ld [7];
  Integer dims [7];
  long local_208;
  int local_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [40];
  Integer local_1c0;
  long local_1b8 [7];
  long alStack_180 [9];
  Integer *local_138;
  Integer local_130;
  long local_128 [8];
  long local_e8 [8];
  long local_a8 [8];
  Integer local_68 [7];
  
  local_138 = hi;
  IVar3 = pnga_nodeid();
  bVar13 = _ga_sync_begin != 0;
  local_1fc = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar13) {
    GA_Sync();
  }
  pnga_inquire(*g_a,&local_130,&local_1c0,local_68);
  pnga_distribution(*g_a,IVar3,alStack_180 + 1,local_1b8);
  lVar4 = pnga_patch_intersect(lo,local_138,alStack_180 + 1,local_1b8,local_1c0);
  if (lVar4 != 0) {
    pnga_access_ptr(*g_a,alStack_180 + 1,local_1b8,&local_208,local_a8);
    IVar3 = local_1c0;
    lVar11 = 1;
    if (1 < local_1c0) {
      lVar7 = 1;
      do {
        lVar11 = lVar11 * ((local_1b8[lVar7] - alStack_180[lVar7 + 1]) + 1);
        lVar7 = lVar7 + 1;
      } while (local_1c0 != lVar7);
    }
    local_1f8 = ZEXT816(0);
    local_e8[0] = 1;
    local_e8[1] = 1;
    local_128[0] = local_a8[0];
    local_128[1] = local_a8[0] * local_a8[1];
    if (2 < local_1c0) {
      memset(local_1e8,0,local_1c0 * 8 - 0x10);
      lVar8 = 2;
      lVar7 = local_128[1];
      lVar9 = local_e8[1];
      do {
        lVar9 = lVar9 * (((&local_1c0)[lVar8] - alStack_180[lVar8]) + 1);
        lVar7 = lVar7 * local_a8[lVar8];
        local_e8[lVar8] = lVar9;
        local_128[lVar8] = lVar7;
        lVar8 = lVar8 + 1;
      } while (IVar3 != lVar8);
    }
    auVar2 = _DAT_001b7030;
    auVar1 = _DAT_001b7020;
    auVar15 = _DAT_001b7010;
    switch(local_130) {
    case 0x3e9:
      if (0 < lVar11) {
        lVar7 = local_1b8[0] - alStack_180[1];
        auVar14._8_4_ = (int)lVar7;
        auVar14._0_8_ = lVar7;
        auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar9 = 0;
        auVar14 = auVar14 ^ _DAT_001b7030;
        do {
          if (IVar3 < 2) {
            lVar8 = 0;
          }
          else {
            lVar12 = 0;
            lVar8 = 0;
            do {
              lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              if ((lVar9 + 1) % local_e8[lVar12 + 1] == 0) {
                *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10 + 1;
              }
              lVar8 = lVar8 + lVar10 * local_128[lVar12];
              lVar10 = 0;
              if (*(long *)(local_1f8 + lVar12 * 8 + 8) <=
                  local_1b8[lVar12 + 1] - alStack_180[lVar12 + 2]) {
                lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              }
              *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10;
              lVar12 = lVar12 + 1;
            } while (IVar3 + -1 != lVar12);
          }
          uVar6 = lVar7 + 4U & 0xfffffffffffffffc;
          auVar23 = auVar1;
          auVar19 = auVar15;
          if (alStack_180[1] <= local_1b8[0]) {
            do {
              auVar22 = auVar23 ^ auVar2;
              iVar16 = auVar14._4_4_;
              iVar17 = (int)lVar8;
              if ((bool)(~(auVar22._4_4_ == iVar16 && auVar14._0_4_ < auVar22._0_4_ ||
                          iVar16 < auVar22._4_4_) & 1)) {
                *(int *)(local_208 + lVar8 * 4) = iVar17;
              }
              if ((auVar22._12_4_ != auVar14._12_4_ || auVar22._8_4_ <= auVar14._8_4_) &&
                  auVar22._12_4_ <= auVar14._12_4_) {
                *(int *)(local_208 + 4 + lVar8 * 4) = iVar17 + 1;
              }
              iVar24 = SUB164(auVar19 ^ auVar2,4);
              if (iVar24 <= iVar16 &&
                  (iVar24 != iVar16 || SUB164(auVar19 ^ auVar2,0) <= auVar14._0_4_)) {
                *(int *)(local_208 + 8 + lVar8 * 4) = iVar17 + 2;
                *(int *)(local_208 + 0xc + lVar8 * 4) = iVar17 + 3;
              }
              auVar18._0_8_ = auVar23._0_8_ + 4;
              auVar18._8_8_ = auVar23._8_8_ + 4;
              auVar20._0_8_ = auVar19._0_8_ + 4;
              auVar20._8_8_ = auVar19._8_8_ + 4;
              lVar8 = lVar8 + 4;
              uVar6 = uVar6 - 4;
              auVar23 = auVar18;
              auVar19 = auVar20;
            } while (uVar6 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar11);
      }
      break;
    case 0x3ea:
      if (0 < lVar11) {
        lVar7 = 0;
        do {
          if (local_1c0 < 2) {
            lVar9 = 0;
          }
          else {
            lVar8 = local_1c0 + -1;
            lVar12 = 0;
            lVar9 = 0;
            do {
              lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              if ((lVar7 + 1) % local_e8[lVar12 + 1] == 0) {
                *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10 + 1;
              }
              lVar9 = lVar9 + lVar10 * local_128[lVar12];
              lVar10 = 0;
              if (*(long *)(local_1f8 + lVar12 * 8 + 8) <=
                  local_1b8[lVar12 + 1] - alStack_180[lVar12 + 2]) {
                lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              }
              *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10;
              lVar12 = lVar12 + 1;
            } while (lVar8 != lVar12);
          }
          if (alStack_180[1] <= local_1b8[0]) {
            lVar8 = 0;
            do {
              *(long *)(local_208 + lVar9 * 8 + lVar8 * 8) = lVar9 + lVar8;
              bVar13 = lVar8 < local_1b8[0] - alStack_180[1];
              lVar8 = lVar8 + 1;
            } while (bVar13);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar11);
      }
      break;
    case 0x3eb:
      if (0 < lVar11) {
        lVar7 = local_1b8[0] - alStack_180[1];
        auVar19._8_4_ = (int)lVar7;
        auVar19._0_8_ = lVar7;
        auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar9 = 0;
        auVar19 = auVar19 ^ _DAT_001b7030;
        do {
          if (IVar3 < 2) {
            lVar8 = 0;
          }
          else {
            lVar12 = 0;
            lVar8 = 0;
            do {
              lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              if ((lVar9 + 1) % local_e8[lVar12 + 1] == 0) {
                *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10 + 1;
              }
              lVar8 = lVar8 + lVar10 * local_128[lVar12];
              lVar10 = 0;
              if (*(long *)(local_1f8 + lVar12 * 8 + 8) <=
                  local_1b8[lVar12 + 1] - alStack_180[lVar12 + 2]) {
                lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              }
              *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10;
              lVar12 = lVar12 + 1;
            } while (IVar3 + -1 != lVar12);
          }
          if (alStack_180[1] <= local_1b8[0]) {
            lVar8 = lVar8 + 3;
            uVar6 = lVar7 + 4U & 0xfffffffffffffffc;
            auVar22 = auVar1;
            auVar21 = auVar15;
            do {
              auVar23 = auVar22 ^ auVar2;
              iVar17 = auVar19._4_4_;
              if ((bool)(~(auVar23._4_4_ == iVar17 && auVar19._0_4_ < auVar23._0_4_ ||
                          iVar17 < auVar23._4_4_) & 1)) {
                *(float *)(local_208 + -0xc + lVar8 * 4) = (float)(lVar8 + -3);
              }
              if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
                  auVar23._12_4_ <= auVar19._12_4_) {
                *(float *)(local_208 + -8 + lVar8 * 4) = (float)(lVar8 + -2);
              }
              iVar16 = SUB164(auVar21 ^ auVar2,4);
              if (iVar16 <= iVar17 &&
                  (iVar16 != iVar17 || SUB164(auVar21 ^ auVar2,0) <= auVar19._0_4_)) {
                *(float *)(local_208 + -4 + lVar8 * 4) = (float)(lVar8 + -1);
                *(float *)(local_208 + lVar8 * 4) = (float)lVar8;
              }
              lVar12 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 4;
              auVar22._8_8_ = lVar12 + 4;
              lVar12 = auVar21._8_8_;
              auVar21._0_8_ = auVar21._0_8_ + 4;
              auVar21._8_8_ = lVar12 + 4;
              lVar8 = lVar8 + 4;
              uVar6 = uVar6 - 4;
            } while (uVar6 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar11);
      }
      break;
    case 0x3ec:
      if (0 < lVar11) {
        lVar7 = local_1b8[0] - alStack_180[1];
        auVar15._8_4_ = (int)lVar7;
        auVar15._0_8_ = lVar7;
        auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar9 = 0;
        auVar15 = auVar15 ^ _DAT_001b7030;
        do {
          if (IVar3 < 2) {
            lVar8 = 0;
          }
          else {
            lVar12 = 0;
            lVar8 = 0;
            do {
              lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              if ((lVar9 + 1) % local_e8[lVar12 + 1] == 0) {
                *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10 + 1;
              }
              lVar8 = lVar8 + lVar10 * local_128[lVar12];
              lVar10 = 0;
              if (*(long *)(local_1f8 + lVar12 * 8 + 8) <=
                  local_1b8[lVar12 + 1] - alStack_180[lVar12 + 2]) {
                lVar10 = *(long *)(local_1f8 + lVar12 * 8 + 8);
              }
              *(long *)(local_1f8 + lVar12 * 8 + 8) = lVar10;
              lVar12 = lVar12 + 1;
            } while (IVar3 + -1 != lVar12);
          }
          if (alStack_180[1] <= local_1b8[0]) {
            lVar8 = lVar8 + 1;
            uVar6 = lVar7 + 2U & 0xfffffffffffffffe;
            auVar23 = auVar1;
            do {
              auVar19 = auVar23 ^ auVar2;
              if ((bool)(~(auVar15._4_4_ < auVar19._4_4_ ||
                          auVar15._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar15._4_4_) & 1)) {
                *(double *)(local_208 + -8 + lVar8 * 8) = (double)(lVar8 + -1);
              }
              if (auVar19._12_4_ <= auVar15._12_4_ &&
                  (auVar19._8_4_ <= auVar15._8_4_ || auVar19._12_4_ != auVar15._12_4_)) {
                *(double *)(local_208 + lVar8 * 8) = (double)lVar8;
              }
              lVar12 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 2;
              auVar23._8_8_ = lVar12 + 2;
              lVar8 = lVar8 + 2;
              uVar6 = uVar6 - 2;
            } while (uVar6 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar11);
      }
      break;
    default:
      GA_Error(" wrong data type ",(int)local_130);
      break;
    case 0x3ee:
      if (0 < lVar11) {
        lVar7 = 0;
        do {
          if (IVar3 < 2) {
            lVar9 = 0;
          }
          else {
            lVar8 = 0;
            lVar9 = 0;
            do {
              lVar12 = *(long *)(local_1f8 + lVar8 * 8 + 8);
              if ((lVar7 + 1) % local_e8[lVar8 + 1] == 0) {
                *(long *)(local_1f8 + lVar8 * 8 + 8) = lVar12 + 1;
              }
              lVar9 = lVar9 + lVar12 * local_128[lVar8];
              lVar12 = 0;
              if (*(long *)(local_1f8 + lVar8 * 8 + 8) <=
                  local_1b8[lVar8 + 1] - alStack_180[lVar8 + 2]) {
                lVar12 = *(long *)(local_1f8 + lVar8 * 8 + 8);
              }
              *(long *)(local_1f8 + lVar8 * 8 + 8) = lVar12;
              lVar8 = lVar8 + 1;
            } while (IVar3 + -1 != lVar8);
          }
          lVar8 = (local_1b8[0] - alStack_180[1]) + 1;
          if (alStack_180[1] <= local_1b8[0]) {
            do {
              *(float *)(local_208 + lVar9 * 8) = (float)lVar9;
              *(float *)(local_208 + 4 + lVar9 * 8) = (float)lVar9;
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar11);
      }
      break;
    case 0x3ef:
      if (0 < lVar11) {
        lVar7 = 0;
        do {
          if (IVar3 < 2) {
            lVar9 = 0;
          }
          else {
            lVar8 = 0;
            lVar9 = 0;
            do {
              lVar12 = *(long *)(local_1f8 + lVar8 * 8 + 8);
              if ((lVar7 + 1) % local_e8[lVar8 + 1] == 0) {
                *(long *)(local_1f8 + lVar8 * 8 + 8) = lVar12 + 1;
              }
              lVar9 = lVar9 + lVar12 * local_128[lVar8];
              lVar12 = 0;
              if (*(long *)(local_1f8 + lVar8 * 8 + 8) <=
                  local_1b8[lVar8 + 1] - alStack_180[lVar8 + 2]) {
                lVar12 = *(long *)(local_1f8 + lVar8 * 8 + 8);
              }
              *(long *)(local_1f8 + lVar8 * 8 + 8) = lVar12;
              lVar8 = lVar8 + 1;
            } while (IVar3 + -1 != lVar8);
          }
          if (alStack_180[1] <= local_1b8[0]) {
            pdVar5 = (double *)(lVar9 * 0x10 + local_208 + 8);
            lVar8 = (local_1b8[0] - alStack_180[1]) + 1;
            do {
              pdVar5[-1] = (double)lVar9;
              *pdVar5 = (double)lVar9;
              pdVar5 = pdVar5 + 2;
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar11);
      }
    }
    pnga_release_update(*g_a,alStack_180 + 1,local_1b8);
  }
  if (local_1fc != 0) {
    GA_Sync();
  }
  return;
}

Assistant:

void nga_vfill_patch(Integer *g_a, Integer *lo, Integer *hi)
{
  Integer i, j;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  void *data_ptr;
  Integer idx, n1dim;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseld[MAXDIM];
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)GA_Sync(); 

  pnga_inquire(*g_a,  &type, &ndim, dims);

  /* get limits of VISIBLE patch */ 
  pnga_distribution(*g_a, me, loA, hiA);

  /*  determine subset of my local patch to access  */
  /*  Output is in loA and hiA */
  if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

    /* get data_ptr to corner of patch */
    /* ld are leading dimensions INCLUDING ghost cells */
    pnga_access_ptr(*g_a, loA, hiA, &data_ptr, ld);

    /* number of n-element of the first dimension */
    n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiA[i] - loA[i] + 1);

    /* calculate the destination indices */
    bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
    /* baseld[0] = ld[0]
     * baseld[1] = ld[0] * ld[1]
     * baseld[2] = ld[0] * ld[1] * ld[2] .....
     */
    baseld[0] = ld[0]; baseld[1] = baseld[0] *ld[1];
    for(i=2; i<ndim; i++) {
      bvalue[i] = 0;
      bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
      baseld[i] = baseld[i-1] * ld[i];
    }

    switch (type){
      case C_INT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((int *)data_ptr)[idx+j] = (int)(idx+j);
        }
        break;
      case C_DCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((DoubleComplex *)data_ptr)[idx+j].real = (double)(idx+j);
            ((DoubleComplex *)data_ptr)[idx+j].imag = (double)(idx+j);
          }
        }

        break;
      case C_SCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((SingleComplex *)data_ptr)[idx+j].real = (float)(idx+j);
            ((SingleComplex *)data_ptr)[idx+j].imag = (float)(idx+j);
          }
        }

        break;
      case C_DBL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) 
            ((double*)data_ptr)[idx+j] = (double)(idx+j);
        }
        break;
      case C_FLOAT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((float *)data_ptr)[idx+j] = (float)(idx+j);
        }
        break;     
      case C_LONG:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((long *)data_ptr)[idx+j] = (long)(idx+j);
        } 
        break;                          
      default: GA_Error(" wrong data type ",type);
    }

    /* release access to the data */
    pnga_release_update(*g_a, loA, hiA);
  }
  if(local_sync_end)GA_Sync();
}